

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_pcmpistri_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  byte ctrl_00;
  int valids;
  int validd;
  uint val;
  int local_4c;
  uint res;
  uint32_t ctrl_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  ctrl_00 = (byte)ctrl;
  valids = pcmp_ilen(s,ctrl_00);
  validd = pcmp_ilen(d,ctrl_00);
  val = pcmpxstrx(env,d,s,ctrl_00,valids,validd);
  if (val == 0) {
    env->regs[1] = (long)(0x10 >> (ctrl_00 & 1));
  }
  else {
    if ((ctrl & 0x40) == 0) {
      local_4c = ctz32(val);
    }
    else {
      local_4c = clz32(val);
      local_4c = 0x1f - local_4c;
    }
    env->regs[1] = (long)local_4c;
  }
  return;
}

Assistant:

void glue(helper_pcmpistri, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if (res) {
        env->regs[R_ECX] = (ctrl & (1 << 6)) ? 31 - clz32(res) : ctz32(res);
    } else {
        env->regs[R_ECX] = 16 >> (ctrl & (1 << 0));
    }
}